

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  Mat *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar3;
  int hcut;
  int wcut;
  Option opt_b_1;
  Mat top_blob_bordered_adj_1;
  Option opt_b;
  Mat top_blob_bordered_adj;
  int i_5;
  int size_3;
  float *outptr_4;
  int i_4;
  float max;
  float min;
  int size_2;
  float *outptr_3;
  int i_3;
  float slope;
  int size_1;
  float *outptr_2;
  int i_2;
  int size;
  float *outptr_1;
  float w_1;
  int k;
  float val;
  Mat m;
  int q;
  float *kptr;
  float *outptr;
  int j_1;
  int i_1;
  float bias;
  Mat out;
  int p;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  Mat top_blob_bordered;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int in_stack_00000588;
  int in_stack_0000058c;
  int in_stack_00000590;
  float in_stack_00000594;
  int in_stack_00000598;
  int in_stack_0000059c;
  int in_stack_000005a0;
  int in_stack_000005a4;
  Mat *in_stack_000005a8;
  Mat *in_stack_000005b0;
  int in_stack_000005c0;
  Option *in_stack_000005c8;
  Mat *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  float in_stack_fffffffffffffc7c;
  undefined4 in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  undefined1 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc89;
  undefined1 in_stack_fffffffffffffc8a;
  undefined1 in_stack_fffffffffffffc8b;
  int in_stack_fffffffffffffc8c;
  Mat *in_stack_fffffffffffffc90;
  float local_34c;
  float local_30c;
  undefined1 local_2d8 [112];
  undefined1 local_268 [112];
  int local_1f8;
  int local_1f4;
  float *local_1f0;
  int local_1e8;
  float local_1e4;
  float local_1e0;
  int local_1dc;
  float *local_1d8;
  int local_1cc;
  float local_1c8;
  int local_1c4;
  float *local_1c0;
  float local_1b4;
  int local_1b0;
  int local_1ac;
  float *local_1a8;
  float local_19c;
  int local_198;
  float local_194;
  Mat local_190;
  int local_14c;
  float *local_148;
  float *local_140;
  int local_134;
  int local_130;
  float local_12c;
  Mat local_128;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  reference local_d0;
  vector<int,_std::allocator<int>_> local_c0;
  int local_a4;
  int local_a0;
  Mat local_90;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_28;
  long local_20;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = *(int *)(in_RDI + 0xc4) * (*(int *)(in_RDI + 0xbc) + -1) + 1;
  local_48 = *(int *)(in_RDI + 200) * (*(int *)(in_RDI + 0xc0) + -1) + 1;
  local_4c = (local_2c + -1) * *(int *)(in_RDI + 0xcc) + local_44;
  local_50 = (local_30 + -1) * *(int *)(in_RDI + 0xd0) + local_48;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Mat::Mat(&local_90);
  if ((((*(int *)(in_RDI + 0xd4) < 1) && (*(int *)(in_RDI + 0xd8) < 1)) &&
      (*(int *)(in_RDI + 0xdc) < 1)) &&
     (((*(int *)(in_RDI + 0xe0) < 1 && (*(int *)(in_RDI + 0xe4) < 1)) &&
      ((*(int *)(in_RDI + 0xe8) < 1 &&
       ((*(int *)(in_RDI + 0xec) < 1 || (*(int *)(in_RDI + 0xf0) < 1)))))))) {
    Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                   in_stack_fffffffffffffc70);
    Mat::create(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                CONCAT13(in_stack_fffffffffffffc8b,
                         CONCAT12(in_stack_fffffffffffffc8a,
                                  CONCAT11(in_stack_fffffffffffffc89,in_stack_fffffffffffffc88))),
                in_stack_fffffffffffffc84,
                CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                (Allocator *)in_stack_fffffffffffffc70);
  }
  else {
    Mat::create(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                CONCAT13(in_stack_fffffffffffffc8b,
                         CONCAT12(in_stack_fffffffffffffc8a,
                                  CONCAT11(in_stack_fffffffffffffc89,in_stack_fffffffffffffc88))),
                in_stack_fffffffffffffc84,
                CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                (Allocator *)in_stack_fffffffffffffc70);
  }
  bVar1 = Mat::empty(in_stack_fffffffffffffc70);
  if (bVar1) {
    local_4 = -100;
    local_a0 = 1;
    goto LAB_0014d964;
  }
  local_a4 = *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc0);
  std::allocator<int>::allocator((allocator<int> *)0x14c96f);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
             CONCAT44(in_stack_fffffffffffffc8c,
                      CONCAT13(in_stack_fffffffffffffc8b,
                               CONCAT12(in_stack_fffffffffffffc8a,
                                        CONCAT11(in_stack_fffffffffffffc89,in_stack_fffffffffffffc88
                                                )))),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
  std::allocator<int>::~allocator((allocator<int> *)0x14c99b);
  local_d0 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,0);
  local_d4 = 0;
  local_d8 = 0;
  local_dc = local_4c * *(int *)(in_RDI + 200) - *(int *)(in_RDI + 0xbc) * *(int *)(in_RDI + 0xc4);
  for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0xc0); local_e0 = local_e0 + 1) {
    for (local_e4 = 0; local_e4 < *(int *)(in_RDI + 0xbc); local_e4 = local_e4 + 1) {
      local_d0[local_d4] = local_d8;
      local_d4 = local_d4 + 1;
      local_d8 = *(int *)(in_RDI + 0xc4) + local_d8;
    }
    local_d8 = local_dc + local_d8;
  }
  for (local_e8 = 0; local_e8 < *(int *)(in_RDI + 0xb8); local_e8 = local_e8 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                 (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    if (*(int *)(in_RDI + 0xf4) == 0) {
      local_30c = 0.0;
    }
    else {
      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x180),(long)local_e8);
      local_30c = *pfVar2;
    }
    local_12c = local_30c;
    Mat::fill((Mat *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
              in_stack_fffffffffffffc7c);
    for (local_130 = 0; local_130 < local_30; local_130 = local_130 + 1) {
      for (local_134 = 0; local_134 < local_2c; local_134 = local_134 + 1) {
        local_140 = Mat::row(&local_128,local_130 * *(int *)(in_RDI + 0xd0));
        local_140 = local_140 + local_134 * *(int *)(in_RDI + 0xcc);
        local_148 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x140));
        local_148 = local_148 + local_a4 * local_34 * local_e8;
        for (local_14c = 0; local_14c < local_34; local_14c = local_14c + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       (int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
          pfVar2 = Mat::row(&local_190,local_130);
          local_194 = pfVar2[local_134];
          for (local_198 = 0; local_198 < local_a4; local_198 = local_198 + 1) {
            local_19c = local_148[local_198];
            local_140[local_d0[local_198]] = local_194 * local_19c + local_140[local_d0[local_198]];
          }
          local_148 = local_148 + local_a4;
          Mat::~Mat((Mat *)0x14ce15);
        }
      }
    }
    if (*(int *)(in_RDI + 0xfc) == 1) {
      local_1a8 = Mat::operator_cast_to_float_(&local_128);
      local_1ac = local_4c * local_50;
      for (local_1b0 = 0; local_1b0 < local_1ac; local_1b0 = local_1b0 + 1) {
        local_1b4 = 0.0;
        pfVar2 = std::max<float>(local_1a8 + local_1b0,&local_1b4);
        local_1a8[local_1b0] = *pfVar2;
      }
    }
    else if (*(int *)(in_RDI + 0xfc) == 2) {
      local_1c0 = Mat::operator_cast_to_float_(&local_128);
      local_1c4 = local_4c * local_50;
      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x100),0);
      local_1c8 = *pfVar2;
      for (local_1cc = 0; local_1cc < local_1c4; local_1cc = local_1cc + 1) {
        if (local_1c0[local_1cc] <= 0.0) {
          local_34c = local_1c0[local_1cc] * local_1c8;
        }
        else {
          local_34c = local_1c0[local_1cc];
        }
        local_1c0[local_1cc] = local_34c;
      }
    }
    else if (*(int *)(in_RDI + 0xfc) == 3) {
      local_1d8 = Mat::operator_cast_to_float_(&local_128);
      local_1dc = local_4c * local_50;
      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x100),0);
      local_1e0 = *pfVar2;
      pfVar2 = Mat::operator[]((Mat *)(in_RDI + 0x100),1);
      local_1e4 = *pfVar2;
      for (local_1e8 = 0; local_1e8 < local_1dc; local_1e8 = local_1e8 + 1) {
        if (local_1d8[local_1e8] < local_1e0) {
          local_1d8[local_1e8] = local_1e0;
        }
        if (local_1e4 < local_1d8[local_1e8]) {
          local_1d8[local_1e8] = local_1e4;
        }
      }
    }
    else if (*(int *)(in_RDI + 0xfc) == 4) {
      local_1f0 = Mat::operator_cast_to_float_(&local_128);
      local_1f4 = local_4c * local_50;
      for (local_1f8 = 0; local_1f8 < local_1f4; local_1f8 = local_1f8 + 1) {
        dVar3 = std::exp((double)((ulong)(uint)local_1f0[local_1f8] ^ 0x8000000080000000));
        local_1f0[local_1f8] = 1.0 / (SUB84(dVar3,0) + 1.0);
      }
    }
    Mat::~Mat((Mat *)0x14d2ba);
  }
  if ((((*(int *)(in_RDI + 0xd4) < 1) && (*(int *)(in_RDI + 0xd8) < 1)) &&
      (*(int *)(in_RDI + 0xdc) < 1)) && (*(int *)(in_RDI + 0xe0) < 1)) {
    if ((*(int *)(in_RDI + 0xec) < 1) || (*(int *)(in_RDI + 0xf0) < 1)) {
      if ((*(int *)(in_RDI + 0xe4) < 1) && (*(int *)(in_RDI + 0xe8) < 1)) {
        Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                       in_stack_fffffffffffffc70);
      }
      else {
        copy_make_border(in_stack_000005b0,in_stack_000005a8,in_stack_000005a4,in_stack_000005a0,
                         in_stack_0000059c,in_stack_00000598,in_stack_000005c0,in_stack_00000594,
                         in_stack_000005c8);
        bVar1 = Mat::empty(local_28);
        in_stack_fffffffffffffc84 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc84);
        if (bVar1) {
          local_4 = -100;
          local_a0 = 1;
          goto LAB_0014d946;
        }
      }
    }
    else {
      Mat::Mat((Mat *)(local_2d8 + 0x30),&local_90);
      if ((*(int *)(in_RDI + 0xe4) < 1) && (*(int *)(in_RDI + 0xe8) < 1)) {
LAB_0014d66e:
        if ((((*(int *)(in_RDI + 0xd4) == -0xe9) || (*(int *)(in_RDI + 0xd8) == -0xe9)) ||
            (*(int *)(in_RDI + 0xdc) == -0xe9)) || (*(int *)(in_RDI + 0xe0) == -0xe9)) {
          copy_cut_border((Mat *)CONCAT44(in_stack_000005a4,in_stack_000005a0),
                          (Mat *)CONCAT44(in_stack_0000059c,in_stack_00000598),
                          (int)in_stack_00000594,in_stack_00000590,in_stack_0000058c,
                          in_stack_00000588,(Option *)in_stack_000005b0);
        }
        else if (((*(int *)(in_RDI + 0xd4) == -0xea) || (*(int *)(in_RDI + 0xd8) == -0xea)) ||
                ((*(int *)(in_RDI + 0xdc) == -0xea || (*(int *)(in_RDI + 0xe0) == -0xea)))) {
          copy_cut_border((Mat *)CONCAT44(in_stack_000005a4,in_stack_000005a0),
                          (Mat *)CONCAT44(in_stack_0000059c,in_stack_00000598),
                          (int)in_stack_00000594,in_stack_00000590,in_stack_0000058c,
                          in_stack_00000588,(Option *)in_stack_000005b0);
        }
        bVar1 = Mat::empty(in_stack_fffffffffffffc70);
        if (bVar1) {
          local_4 = -100;
          local_a0 = 1;
        }
        else {
          local_4c = *(int *)(local_20 + 0x2c);
          local_50 = *(int *)(local_20 + 0x30);
          local_a0 = 0;
        }
      }
      else {
        local_2d8._32_8_ = local_28->allocator;
        local_2d8._0_8_ = local_28->data;
        local_2d8._16_8_ = local_28->elemsize;
        local_2d8._24_4_ = local_28->elempack;
        local_2d8._28_4_ = *(undefined4 *)&local_28->field_0x1c;
        local_2d8._8_8_ = local_28->elemsize;
        in_stack_fffffffffffffc70 = (Mat *)local_2d8;
        copy_make_border(in_stack_000005b0,in_stack_000005a8,in_stack_000005a4,in_stack_000005a0,
                         in_stack_0000059c,in_stack_00000598,in_stack_000005c0,in_stack_00000594,
                         in_stack_000005c8);
        bVar1 = Mat::empty(in_stack_fffffffffffffc70);
        if (!bVar1) goto LAB_0014d66e;
        local_4 = -100;
        local_a0 = 1;
      }
      Mat::~Mat((Mat *)0x14d856);
      if (local_a0 != 0) goto LAB_0014d946;
    }
LAB_0014d930:
    local_4 = 0;
    local_a0 = 1;
  }
  else {
    Mat::Mat((Mat *)(local_268 + 0x30),&local_90);
    if ((*(int *)(in_RDI + 0xe4) < 1) && (*(int *)(in_RDI + 0xe8) < 1)) {
LAB_0014d450:
      copy_cut_border((Mat *)CONCAT44(in_stack_000005a4,in_stack_000005a0),
                      (Mat *)CONCAT44(in_stack_0000059c,in_stack_00000598),(int)in_stack_00000594,
                      in_stack_00000590,in_stack_0000058c,in_stack_00000588,
                      (Option *)in_stack_000005b0);
      bVar1 = Mat::empty(in_stack_fffffffffffffc70);
      if (bVar1) {
        local_4 = -100;
        local_a0 = 1;
      }
      else {
        local_4c = *(int *)(local_20 + 0x2c);
        local_50 = *(int *)(local_20 + 0x30);
        local_a0 = 0;
      }
    }
    else {
      local_268._32_8_ = local_28->allocator;
      local_268._0_8_ = local_28->data;
      local_268._16_8_ = local_28->elemsize;
      local_268._24_4_ = local_28->elempack;
      local_268._28_4_ = *(undefined4 *)&local_28->field_0x1c;
      local_268._8_8_ = local_28->elemsize;
      in_stack_fffffffffffffc70 = (Mat *)local_268;
      copy_make_border(in_stack_000005b0,in_stack_000005a8,in_stack_000005a4,in_stack_000005a0,
                       in_stack_0000059c,in_stack_00000598,in_stack_000005c0,in_stack_00000594,
                       in_stack_000005c8);
      bVar1 = Mat::empty(in_stack_fffffffffffffc70);
      if (!bVar1) goto LAB_0014d450;
      local_4 = -100;
      local_a0 = 1;
    }
    Mat::~Mat((Mat *)0x14d508);
    if (local_a0 == 0) goto LAB_0014d930;
  }
LAB_0014d946:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
LAB_0014d964:
  Mat::~Mat((Mat *)0x14d971);
  return local_4;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || output_pad_right > 0 || output_pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i*stride_h) + j*stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        copy_cut_border(top_blob_bordered_adj, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else if (output_w > 0 && output_h > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        int wcut = top_blob_bordered_adj.w - output_w;
        int hcut = top_blob_bordered_adj.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            copy_make_border(top_blob_bordered, top_blob, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt);
            if (top_blob.empty())
                return -100;
        }
        else
        {
            top_blob = top_blob_bordered;
        }
    }

    return 0;
}